

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O1

void __thiscall
AI::HierarchicalTaskNetworkComponent::joinConversation(HierarchicalTaskNetworkComponent *this)

{
  pointer pcVar1;
  char *__s;
  char *pcVar2;
  World *this_00;
  GameMode *this_01;
  TaskDatabase *this_02;
  mapped_type *pmVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  executeFinally(&(this->planner).plan,&this->state);
  this_00 = Component::getWorld(&this->super_Component);
  this_01 = World::getAuthGameMode(this_00);
  this_02 = GameMode::getAvailableTasks(this_01);
  this->currentGoal = JoinConversation;
  Actor::getName_abi_cxx11_(&local_40,(this->super_Component).owner);
  pmVar3 = std::
           map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
           ::operator[](&this_02->tasks,&this->currentGoal);
  pcVar1 = (pmVar3->debugName)._M_dataplus._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (pmVar3->debugName)._M_string_length);
  log<char_const*,std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
            ("[",&local_40,"] ","New goal: ",&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  updateTaskHistory(this);
  createPlan(this,this->currentGoal);
  pmVar3 = std::
           map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
           ::operator[](&this_02->tasks,&this->currentGoal);
  __s = (pmVar3->debugName)._M_dataplus._M_p;
  pcVar2 = (char *)(this->currentGoalName)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&this->currentGoalName,0,pcVar2,(ulong)__s);
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::joinConversation()
{
	executeFinally(planner.plan, state);
	auto& tasks = static_cast<GameMode*>(getWorld()->getAuthGameMode())->getAvailableTasks();

	currentGoal = TaskIdentifier::JoinConversation;

#ifdef SHOW_PLANNER_INFORMATION_MESSAGES
	log("[", owner->getName(), "] ", "New goal: ", tasks.tasks[currentGoal].debugName);
#endif

	updateTaskHistory();		

	createPlan(currentGoal);

	currentGoalName = tasks.tasks[currentGoal].debugName.c_str();
}